

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

bool gl4cts::EnhancedLayouts::Utils::checkUniform
               (Program *program,Variable *variable,stringstream *stream)

{
  Interface *pIVar1;
  pointer pDVar2;
  bool bVar3;
  size_type __new_size;
  ostream *poVar4;
  TestError *this;
  size_t i;
  long lVar5;
  size_type sVar6;
  long lVar7;
  vector<int,_std::allocator<int>_> offsets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names_str;
  vector<const_char_*,_std::allocator<const_char_*>_> names;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  string local_70;
  string local_50;
  
  bVar3 = Variable::IsBlock(variable);
  if (bVar3) {
    pIVar1 = (variable->m_descriptor).field_9.m_interface;
    __new_size = ((long)(pIVar1->m_members).
                        super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pIVar1->m_members).
                       super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x70;
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    names_str.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    names_str.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    names_str.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&indices,__new_size);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::resize(&names,__new_size);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&names_str,__new_size);
    std::vector<int,_std::allocator<int>_>::resize(&offsets,__new_size);
    lVar5 = 0;
    lVar7 = 0;
    for (sVar6 = 0; __new_size != sVar6; sVar6 = sVar6 + 1) {
      indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[sVar6] = 0;
      offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [sVar6] = 0;
      Variable::GetReference
                (&local_50,&pIVar1->m_name,
                 (Descriptor *)
                 ((long)&((pIVar1->m_members).
                          super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_expected_component + lVar7),
                 BASIC,0);
      pDVar2 = (pIVar1->m_members).
               super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(int *)((long)&pDVar2->m_type + lVar7) == 1) {
        Variable::GetReference
                  (&local_70,&local_50,
                   (Descriptor *)**(undefined8 **)((long)&pDVar2->field_9 + lVar7),BASIC,0);
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((long)&((names_str.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5))
        ;
        std::__cxx11::string::~string((string *)&local_70);
      }
      else {
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((long)&((names_str.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5))
        ;
      }
      names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start[sVar6] =
           *(char **)((long)&((names_str.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5
                     );
      std::__cxx11::string::~string((string *)&local_50);
      lVar7 = lVar7 + 0x70;
      lVar5 = lVar5 + 0x20;
    }
    Program::GetUniformIndices
              (program,(GLsizei)__new_size,
               names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start,
               indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    Program::GetActiveUniformsiv
              (program,(GLsizei)__new_size,
               indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,0x8a3b,
               offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start);
    bVar3 = true;
    lVar5 = 0x34;
    for (sVar6 = 0; __new_size != sVar6; sVar6 = sVar6 + 1) {
      pDVar2 = (pIVar1->m_members).
               super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar6] != *(int *)((long)&pDVar2->m_expected_component + lVar5)) {
        poVar4 = std::operator<<((ostream *)(stream + 0x10),"Uniform: ");
        poVar4 = std::operator<<(poVar4,(string *)((long)pDVar2 + lVar5 + -0x24));
        poVar4 = std::operator<<(poVar4," - invalid offset: ");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[sVar6]);
        poVar4 = std::operator<<(poVar4," expected: ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::endl<char,std::char_traits<char>>(poVar4);
        bVar3 = false;
      }
      lVar5 = lVar5 + 0x70;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&offsets.super__Vector_base<int,_std::allocator<int>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&names_str);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              (&names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    return bVar3;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,"Not implemented",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
             ,0x476);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool checkUniform(Program& program, const Utils::Variable& variable, std::stringstream& stream)
{
	bool result = true;

	if (false == variable.IsBlock())
	{
		TCU_FAIL("Not implemented");
	}
	else
	{
		Utils::Interface* interface = variable.m_descriptor.m_interface;

		size_t size = interface->m_members.size();

		std::vector<GLuint>		 indices;
		std::vector<const char*> names;
		std::vector<std::string> names_str;
		std::vector<GLint>		 offsets;

		indices.resize(size);
		names.resize(size);
		names_str.resize(size);
		offsets.resize(size);

		for (size_t i = 0; i < size; ++i)
		{
			indices[i] = 0;
			offsets[i] = 0;

			const std::string& name =
				Utils::Variable::GetReference(interface->m_name, interface->m_members[i], Utils::Variable::BASIC, 0);

			if (Utils::Variable::INTERFACE == interface->m_members[i].m_type)
			{
				const std::string& member_name = Utils::Variable::GetReference(
					name, interface->m_members[i].m_interface->m_members[0], Utils::Variable::BASIC, 0);

				names_str[i] = member_name;
			}
			else
			{
				names_str[i] = name;
			}

			names[i] = names_str[i].c_str();
		}

		try
		{
			program.GetUniformIndices(static_cast<glw::GLsizei>(size), &names[0], &indices[0]);
			program.GetActiveUniformsiv(static_cast<glw::GLsizei>(size), &indices[0], GL_UNIFORM_OFFSET, &offsets[0]);
		}
		catch (std::exception& exc)
		{
			stream << "Failed to query program for uniforms in block: " << variable.m_descriptor.m_name
				   << ". Reason: " << exc.what() << "\n";

			return false;
		}

		for (size_t i = 0; i < size; ++i)
		{
			Utils::Variable::Descriptor& desc = interface->m_members[i];

			if (offsets[i] != (GLint)desc.m_offset)
			{
				stream << "Uniform: " << desc.m_name << " - invalid offset: " << offsets[i]
					   << " expected: " << desc.m_offset << std::endl;
				result = false;
			}
		}
	}

	return result;
}